

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_socket.c
# Opt level: O1

void accept_callback(void *context,cio_epoll_error error)

{
  int client_fd;
  cio_error cVar1;
  cio_socket *socket;
  socklen_t addrlen;
  sockaddr_storage addr;
  socklen_t local_9c;
  sockaddr local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (error == CIO_EPOLL_SUCCESS) {
    local_28 = 0;
    uStack_20 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98.sa_family = 0;
    local_98.sa_data[0] = '\0';
    local_98.sa_data[1] = '\0';
    local_98.sa_data[2] = '\0';
    local_98.sa_data[3] = '\0';
    local_98.sa_data[4] = '\0';
    local_98.sa_data[5] = '\0';
    local_98.sa_data[6] = '\0';
    local_98.sa_data[7] = '\0';
    local_98.sa_data[8] = '\0';
    local_98.sa_data[9] = '\0';
    local_98.sa_data[10] = '\0';
    local_98.sa_data[0xb] = '\0';
    local_98.sa_data[0xc] = '\0';
    local_98.sa_data[0xd] = '\0';
    local_9c = 0x80;
    client_fd = accept4(*(int *)((long)context + 0x20),&local_98,&local_9c,0x80800);
    if (client_fd == -1) {
      accept_callback_cold_3();
    }
    else {
      socket = (cio_socket *)(**(code **)((long)context + 0x50))();
      if (socket == (cio_socket *)0x0) {
        accept_callback_cold_2();
      }
      else {
        cVar1 = cio_linux_socket_init
                          (socket,client_fd,*(cio_eventloop **)((long)context + 0x28),*context,
                           *(cio_socket_close_hook_t *)((long)context + 0x58));
        if (cVar1 == CIO_SUCCESS) {
          (**(code **)((long)context + 0x40))
                    (context,*(undefined8 *)((long)context + 0x48),0,socket);
        }
        else {
          (**(code **)((long)context + 0x40))(context,*(undefined8 *)((long)context + 0x48),cVar1,0)
          ;
          close(client_fd);
          (**(code **)((long)context + 0x58))(socket);
        }
      }
    }
  }
  else {
    accept_callback_cold_1();
  }
  return;
}

Assistant:

static void accept_callback(void *context, enum cio_epoll_error error)
{
	struct cio_server_socket *server_socket = context;

	if (cio_unlikely(error != CIO_EPOLL_SUCCESS)) {
		enum cio_error err = cio_linux_get_socket_error(server_socket->impl.ev.fd);
		server_socket->handler(server_socket, server_socket->handler_context, err, NULL);
		return;
	}

	int fd = server_socket->impl.ev.fd;

	struct sockaddr_storage addr;
	memset(&addr, 0, sizeof(addr));
	socklen_t addrlen = sizeof(addr);

	int client_fd = accept4(fd, (struct sockaddr *)&addr, &addrlen, (unsigned int)SOCK_NONBLOCK | (unsigned int)SOCK_CLOEXEC);
	if (cio_unlikely(client_fd == -1)) {
		if ((errno != EAGAIN) && (errno != EBADF)) {
			server_socket->handler(server_socket, server_socket->handler_context, (enum cio_error)(-errno), NULL);
		}
	} else {
		struct cio_socket *client_socket = server_socket->alloc_client();
		if (cio_unlikely(client_socket == NULL)) {
			server_socket->handler(server_socket, server_socket->handler_context, CIO_NO_MEMORY, client_socket);
			close(client_fd);
			return;
		}

		enum cio_error err = cio_linux_socket_init(client_socket, client_fd, server_socket->impl.loop, server_socket->impl.close_timeout_ns, server_socket->free_client);
		if (cio_likely(err == CIO_SUCCESS)) {
			server_socket->handler(server_socket, server_socket->handler_context, err, client_socket);
		} else {
			server_socket->handler(server_socket, server_socket->handler_context, err, NULL);
			close(client_fd);
			server_socket->free_client(client_socket);
		}
	}
}